

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayoutItem::write(DomLayoutItem *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  Kind KVar3;
  size_t __n_00;
  undefined4 in_register_00000034;
  QAnyStringView *size;
  long in_FS_OFFSET;
  char16_t *str;
  DomLayoutItem *in_stack_fffffffffffffd38;
  DomSpacer *this_00;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffd40;
  QString *in_stack_fffffffffffffd48;
  DomLayout *this_01;
  QAnyStringView *in_stack_fffffffffffffd50;
  char16_t *in_stack_fffffffffffffd58;
  DomWidget *this_02;
  undefined1 local_220 [24];
  undefined1 local_208 [24];
  undefined1 local_1f0 [88];
  QAnyStringView *local_198;
  undefined1 local_188 [64];
  QAnyStringView *local_148;
  undefined1 local_138 [64];
  QAnyStringView *local_f8;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  size = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1af695);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"layoutitem",10);
    QString::QString((QString *)in_stack_fffffffffffffd40,(DataPointer *)in_stack_fffffffffffffd38);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffd38);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  QXmlStreamWriter::writeStartElement(size);
  QString::~QString((QString *)0x1af757);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffd40);
  }
  bVar1 = hasAttributeRow(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    iVar2 = attributeRow(this);
    QString::number((int)local_98,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    QXmlStreamWriter::writeAttribute(size,local_58);
    QString::~QString((QString *)0x1af825);
    QString::~QString((QString *)0x1af832);
  }
  bVar1 = hasAttributeColumn(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    iVar2 = attributeColumn(this);
    QString::number((int)local_e8,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    QXmlStreamWriter::writeAttribute(size,local_a8);
    QString::~QString((QString *)0x1af8ea);
    QString::~QString((QString *)0x1af8f7);
  }
  bVar1 = hasAttributeRowSpan(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    iVar2 = attributeRowSpan(this);
    QString::number((int)local_138,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    QXmlStreamWriter::writeAttribute(size,local_f8);
    QString::~QString((QString *)0x1af9af);
    QString::~QString((QString *)0x1af9bc);
  }
  bVar1 = hasAttributeColSpan(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    iVar2 = attributeColSpan(this);
    QString::number((int)local_188,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    QXmlStreamWriter::writeAttribute(size,local_148);
    QString::~QString((QString *)0x1afa74);
    QString::~QString((QString *)0x1afa81);
  }
  bVar1 = hasAttributeAlignment(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    attributeAlignment(in_stack_fffffffffffffd38);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    QXmlStreamWriter::writeAttribute(size,local_198);
    QString::~QString((QString *)0x1afb2d);
    QString::~QString((QString *)0x1afb3a);
  }
  KVar3 = kind(this);
  __n_00 = (size_t)KVar3;
  if (KVar3 == Widget) {
    if (this->m_widget != (DomWidget *)0x0) {
      this_02 = this->m_widget;
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)this_02,(size_t)in_stack_fffffffffffffd50);
      DomWidget::write(this_02,__fd,local_1f0,__n_00);
      QString::~QString((QString *)0x1afbd2);
    }
  }
  else if (KVar3 == Layout) {
    if (this->m_layout != (DomLayout *)0x0) {
      this_01 = this->m_layout;
      Qt::Literals::StringLiterals::operator____s(in_stack_fffffffffffffd58,(size_t)size);
      DomLayout::write(this_01,(int)size,local_208,__n_00);
      QString::~QString((QString *)0x1afc3b);
    }
  }
  else if ((KVar3 == Spacer) && (this->m_spacer != (DomSpacer *)0x0)) {
    this_00 = this->m_spacer;
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffffd58,(size_t)in_stack_fffffffffffffd50);
    DomSpacer::write(this_00,(int)size,local_220,__n_00);
    QString::~QString((QString *)0x1afc9f);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutItem::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutitem") : tagName.toLower());

    if (hasAttributeRow())
        writer.writeAttribute(u"row"_s, QString::number(attributeRow()));

    if (hasAttributeColumn())
        writer.writeAttribute(u"column"_s, QString::number(attributeColumn()));

    if (hasAttributeRowSpan())
        writer.writeAttribute(u"rowspan"_s, QString::number(attributeRowSpan()));

    if (hasAttributeColSpan())
        writer.writeAttribute(u"colspan"_s, QString::number(attributeColSpan()));

    if (hasAttributeAlignment())
        writer.writeAttribute(u"alignment"_s, attributeAlignment());

    switch (kind()) {
    case Widget:
        if (m_widget != nullptr)
            m_widget->write(writer, u"widget"_s);
        break;

    case Layout:
        if (m_layout != nullptr)
            m_layout->write(writer, u"layout"_s);
        break;

    case Spacer:
        if (m_spacer != nullptr)
            m_spacer->write(writer, u"spacer"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}